

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSeparator.cpp
# Opt level: O0

void __thiscall
HighsSeparator::run(HighsSeparator *this,HighsLpRelaxation *lpRelaxation,
                   HighsLpAggregator *lpAggregator,HighsTransformedLp *transLp,HighsCutPool *cutpool
                   )

{
  HighsInt HVar1;
  HighsInt HVar2;
  HighsTimer *in_RCX;
  undefined8 in_RDX;
  HighsLpRelaxation *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  HighsTimer *unaff_retaddr;
  HighsInt currNumCuts;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 *puVar3;
  
  *(int *)((long)in_RDI + 0xc) = *(int *)((long)in_RDI + 0xc) + 1;
  puVar3 = in_RDI;
  HVar1 = HighsCutPool::getNumCuts
                    ((HighsCutPool *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  HVar2 = (HighsInt)((ulong)puVar3 >> 0x20);
  HighsLpRelaxation::getMipSolver(in_RSI);
  HighsTimer::start(in_RCX,(HighsInt)((ulong)in_R8 >> 0x20));
  (**(code **)*in_RDI)(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  HighsLpRelaxation::getMipSolver(in_RSI);
  HighsTimer::stop(unaff_retaddr,HVar2);
  HVar2 = HighsCutPool::getNumCuts((HighsCutPool *)CONCAT44(HVar1,in_stack_ffffffffffffffd0));
  *(HighsInt *)(in_RDI + 1) = (HVar2 - HVar1) + *(int *)(in_RDI + 1);
  return;
}

Assistant:

void HighsSeparator::run(HighsLpRelaxation& lpRelaxation,
                         HighsLpAggregator& lpAggregator,
                         HighsTransformedLp& transLp, HighsCutPool& cutpool) {
  ++numCalls;
  HighsInt currNumCuts = cutpool.getNumCuts();

  lpRelaxation.getMipSolver().timer_.start(clockIndex);
  separateLpSolution(lpRelaxation, lpAggregator, transLp, cutpool);
  lpRelaxation.getMipSolver().timer_.stop(clockIndex);

  numCutsFound += cutpool.getNumCuts() - currNumCuts;
}